

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_dpb_mgr.c
# Opt level: O3

WORD32 ihevc_dpb_mgr_insert_ref(dpb_mgr_t *ps_dpb_mgr,pic_buf_t *ps_pic_buf,WORD32 buf_id)

{
  pic_buf_t *ppVar1;
  dpb_info_t *pdVar2;
  long lVar3;
  
  pdVar2 = ps_dpb_mgr->as_dpb_info;
  lVar3 = 8;
  while ((ppVar1 = *(pic_buf_t **)((long)ps_dpb_mgr->as_dpb_info + lVar3 + -8), ppVar1 != ps_pic_buf
         || (ppVar1->u1_used_as_ref == '\0'))) {
    lVar3 = lVar3 + 0x10;
    if (lVar3 == 0x408) {
      lVar3 = 0x40;
      do {
        if (pdVar2->ps_pic_buf == (pic_buf_t *)0x0) {
          pdVar2->ps_pic_buf = ps_pic_buf;
          pdVar2->ps_prev_dpb = ps_dpb_mgr->ps_dpb_head;
          ps_pic_buf->u1_buf_id = (UWORD8)buf_id;
          ps_pic_buf->u1_used_as_ref = '\x02';
          ps_dpb_mgr->ps_dpb_head = pdVar2;
          ps_dpb_mgr->u1_num_ref_bufs = ps_dpb_mgr->u1_num_ref_bufs + '\x01';
          return 0;
        }
        pdVar2 = pdVar2 + 1;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
      return -1;
    }
  }
  return -1;
}

Assistant:

WORD32 ihevc_dpb_mgr_insert_ref(dpb_mgr_t *ps_dpb_mgr,
                                pic_buf_t *ps_pic_buf,
                                WORD32 buf_id)
{
    int i;
    dpb_info_t *ps_dpb_info;

    ps_dpb_info = ps_dpb_mgr->as_dpb_info;

    /* Return error if buffer is already present in the DPB */
    for(i = 0; i < MAX_DPB_BUFS; i++)
    {
        if((ps_dpb_info[i].ps_pic_buf == ps_pic_buf)
                        && (ps_dpb_info[i].ps_pic_buf->u1_used_as_ref))
        {
            return (-1);
        }


    }

    /* Find an unused DPB location */
    for(i = 0; i < MAX_DPB_BUFS; i++)
    {
        if(NULL == ps_dpb_info[i].ps_pic_buf)
        {
            break;
        }
    }
    if(i == MAX_DPB_BUFS)
    {
        return (-1);
    }

    /* Create DPB info */
    ps_dpb_info[i].ps_pic_buf = ps_pic_buf;
    ps_dpb_info[i].ps_prev_dpb = ps_dpb_mgr->ps_dpb_head;
    ps_dpb_info[i].ps_pic_buf->u1_buf_id = buf_id;
    ps_dpb_info[i].ps_pic_buf->u1_used_as_ref = SHORT_TERM_REF;

    /* update the head node of linked list to point to the current picture */
    ps_dpb_mgr->ps_dpb_head = ps_dpb_info + i;

    /* Increment Short term buffer count */
    ps_dpb_mgr->u1_num_ref_bufs++;

    return 0;
}